

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 FormatConsumer(void *pSrc,uint nLen,void *pData)

{
  sxi32 sVar1;
  
  if (*(int *)((long)pData + 4) == 6) {
    sVar1 = SyBlobAppend(*(SyBlob **)((long)pData + 0x10),pSrc,nLen);
  }
  else {
    sVar1 = -10;
    if (*(int *)((long)pData + 4) == 1) {
      sVar1 = (**(code **)((long)pData + 0x10))(pSrc,nLen,*(undefined8 *)((long)pData + 0x18));
    }
  }
  *(uint *)pData = *pData + nLen;
  *(sxi32 *)((long)pData + 8) = sVar1;
  return sVar1;
}

Assistant:

static sxi32 FormatConsumer(const void *pSrc, unsigned int nLen, void *pData)
{
	SyFmtConsumer *pConsumer = (SyFmtConsumer *)pData;
	sxi32 rc = SXERR_ABORT;
	switch(pConsumer->nType){
	case SXFMT_CONS_PROC:
			/* User callback */
			rc = pConsumer->uConsumer.sFunc.xUserConsumer(pSrc, nLen, pConsumer->uConsumer.sFunc.pUserData);
			break;
	case SXFMT_CONS_BLOB:
			/* Blob consumer */
			rc = SyBlobAppend(pConsumer->uConsumer.pBlob, pSrc, (sxu32)nLen);
			break;
		default: 
			/* Unknown consumer */
			break;
	}
	/* Update total number of bytes consumed so far */
	pConsumer->nLen += nLen;
	pConsumer->rc = rc;
	return rc;	
}